

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall test_solvers_2x1::test_method(test_solvers_2x1 *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  local_50;
  unsigned_long uStack_28;
  size_t expected_assignment [2];
  int costs [2];
  test_solvers_2x1 *this_local;
  
  expected_assignment[1] = 1;
  uStack_28 = 1;
  expected_assignment[0] = 0;
  make_matrix<int>(&local_50,(int *)(expected_assignment + 1),2,1);
  make_vector<unsigned_long>(&local_68,&uStack_28,2);
  assert_solvers_result<int>(&local_50,0,&local_68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_68);
  boost::numeric::ublas::
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  ::~matrix(&local_50);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_solvers_2x1)
{
  const int costs[] = {1,
                       0};
  const std::size_t expected_assignment[] = {1, 0};
  assert_solvers_result(make_matrix(costs, 2, 1), 0, make_vector(expected_assignment, 2));
}